

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::min(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Literal local_40;
  double local_28;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == f64) {
    local_28 = getf64(this);
    local_40.field_0.i64 = (int64_t)getf64(other);
    uVar3 = SUB84(local_28,0);
    uVar4 = (undefined4)((ulong)local_28 >> 0x20);
    if (NAN(local_28)) {
      local_40.field_0._0_8_ = local_28;
      local_40.type.id = 5;
      standardizeNaN(__return_storage_ptr__,&local_40);
    }
    else {
      if (!NAN((double)local_40.field_0.i64)) {
        if (((local_28 != 0.0) || (local_28 != (double)local_40.field_0.i64)) ||
           (NAN(local_28) || NAN((double)local_40.field_0.i64))) {
          if (local_28 <= (double)local_40.field_0.i64) {
            local_40.field_0._0_8_ = local_28;
          }
          *(undefined8 *)&__return_storage_ptr__->field_0 = local_40.field_0.i64;
        }
        else {
          if (-1 < (long)local_28) {
            uVar3 = (undefined4)local_40.field_0.i64;
            uVar4 = (undefined4)(local_40.field_0.func.super_IString.str._M_len >> 0x20);
          }
          (__return_storage_ptr__->field_0).i64 = CONCAT44(uVar4,uVar3);
        }
        (__return_storage_ptr__->type).id = 5;
        return __return_storage_ptr__;
      }
      local_40.type.id = 5;
      standardizeNaN(__return_storage_ptr__,&local_40);
    }
  }
  else {
    if (BVar1 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5e2);
    }
    fVar2 = getf32(this);
    local_28 = (double)CONCAT44(local_28._4_4_,fVar2);
    local_40.field_0.i32 = (int32_t)getf32(other);
    if (NAN(local_28._0_4_)) {
      local_40.field_0._0_4_ = local_28._0_4_;
      local_40.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_40);
    }
    else {
      if (!NAN((float)local_40.field_0.i32)) {
        if (((local_28._0_4_ != 0.0) || (local_28._0_4_ != (float)local_40.field_0.i32)) ||
           (NAN(local_28._0_4_) || NAN((float)local_40.field_0.i32))) {
          if (local_28._0_4_ <= (float)local_40.field_0.i32) {
            local_40.field_0._0_4_ = local_28._0_4_;
          }
          *(undefined4 *)&__return_storage_ptr__->field_0 = local_40.field_0.i32;
        }
        else {
          if (-1 < (int)local_28._0_4_) {
            local_28._0_4_ = (float)local_40.field_0.i32;
          }
          *(float *)&__return_storage_ptr__->field_0 = local_28._0_4_;
        }
        (__return_storage_ptr__->type).id = 4;
        return __return_storage_ptr__;
      }
      local_40.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_40);
    }
  }
  ~Literal(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::min(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32: {
      auto l = getf32(), r = other.getf32();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    case Type::f64: {
      auto l = getf64(), r = other.getf64();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}